

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::BasicResourceAtomicCounter::Run(BasicResourceAtomicCounter *this)

{
  bool bVar1;
  long lVar2;
  uvec3 local_30;
  uvec3 local_24;
  
  local_24.m_data[0] = 4;
  local_24.m_data[1] = 3;
  local_24.m_data[2] = 2;
  local_30.m_data[0] = 2;
  local_30.m_data[1] = 3;
  local_30.m_data[2] = 4;
  bVar1 = RunIteration(this,&local_24,&local_30,false);
  lVar2 = -1;
  if (bVar1) {
    local_24.m_data._0_8_ = &DAT_100000001;
    local_24.m_data[2] = 1;
    local_30.m_data._0_8_ = &DAT_100000001;
    local_30.m_data[2] = 1;
    bVar1 = RunIteration(this,&local_24,&local_30,true);
    if (bVar1) {
      local_24.m_data._0_8_ = &DAT_600000001;
      local_24.m_data[2] = 1;
      local_30.m_data._0_8_ = &DAT_100000001;
      local_30.m_data[2] = 8;
      bVar1 = RunIteration(this,&local_24,&local_30,false);
      if (bVar1) {
        local_24.m_data[0] = 4;
        local_24.m_data[1] = 1;
        local_24.m_data[2] = 2;
        local_30.m_data[0] = 10;
        local_30.m_data[1] = 3;
        local_30.m_data[2] = 4;
        bVar1 = RunIteration(this,&local_24,&local_30,true);
        lVar2 = (ulong)bVar1 - 1;
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(4, 3, 2), uvec3(2, 3, 4), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 1), uvec3(1, 1, 1), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 6, 1), uvec3(1, 1, 8), false))
			return ERROR;
		if (!RunIteration(uvec3(4, 1, 2), uvec3(10, 3, 4), true))
			return ERROR;
		return NO_ERROR;
	}